

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perror.c
# Opt level: O0

PError * p_error_new_literal(pint code,pint native_code,pchar *message)

{
  pchar *ppVar1;
  PError *ret;
  pchar *message_local;
  pint native_code_local;
  pint code_local;
  
  _native_code_local = p_error_new();
  if (_native_code_local == (PError *)0x0) {
    _native_code_local = (PError *)0x0;
  }
  else {
    _native_code_local->code = code;
    _native_code_local->native_code = native_code;
    ppVar1 = p_strdup(message);
    _native_code_local->message = ppVar1;
  }
  return _native_code_local;
}

Assistant:

P_LIB_API PError *
p_error_new_literal (pint		code,
		     pint		native_code,
		     const pchar	*message)
{
	PError *ret;

	if (P_UNLIKELY ((ret = p_error_new ()) == NULL))
		return NULL;

	ret->code        = code;
	ret->native_code = native_code;
	ret->message     = p_strdup (message);

	return ret;
}